

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O0

void __thiscall CScheduler::CScheduler(CScheduler *this)

{
  long lVar1;
  multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::thread::thread((thread *)in_RDI);
  AnnotatedMixin<std::mutex>::AnnotatedMixin((AnnotatedMixin<std::mutex> *)in_RDI);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 1));
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>_>
  ::multimap(in_RDI);
  *(undefined4 *)&in_RDI[3]._M_t._M_impl = 0;
  in_RDI[3]._M_t._M_impl.field_0x4 = 0;
  in_RDI[3]._M_t._M_impl.field_0x5 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CScheduler::CScheduler() = default;